

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void encode_block_intra_and_set_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  MACROBLOCKD *xd;
  CommonQuantParams *quant_params;
  char cVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  MACROBLOCK *x;
  MB_MODE_INFO *pMVar7;
  BLOCK_SIZE plane_bsize_00;
  uint16_t *puVar8;
  byte bVar9;
  ulong uVar10;
  TX_TYPE TVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  int dummy_rate_cost;
  uint16_t *local_e0;
  long local_d8;
  long local_d0;
  MB_MODE_INFO *local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  ENTROPY_CONTEXT *local_a8;
  ENTROPY_CONTEXT *local_a0;
  ulong local_98;
  tran_low_t *local_90;
  uint8_t *local_88;
  ulong local_80;
  TXB_CTX txb_ctx;
  TxfmParam txfm_param;
  QUANT_PARAM local_58;
  
  lVar6 = *arg;
  x = *(MACROBLOCK **)((long)arg + 8);
  local_c8 = *(x->e_mbd).mi;
  lVar17 = (long)plane;
  local_c0 = lVar17 * 0x88;
  uVar12 = (x->e_mbd).plane[lVar17].dst.stride;
  local_80 = (ulong)uVar12;
  local_88 = (x->e_mbd).plane[lVar17].dst.buf + (int)((uVar12 * blk_row + blk_col) * 4);
  local_90 = x->plane[lVar17].dqcoeff + (block << 4);
  local_e0 = x->plane[lVar17].eobs;
  dummy_rate_cost = 0;
  xd = &x->e_mbd;
  av1_predict_intra_block_facade((AV1_COMMON *)(lVar6 + 0x3bf80),xd,plane,blk_col,blk_row,tx_size);
  local_d8 = (long)block;
  local_b8 = (ulong)plane_bsize;
  uVar10 = (ulong)tx_size;
  lVar16 = (long)blk_col;
  lVar17 = (long)blk_row;
  local_d0 = lVar17;
  local_b0 = lVar16;
  if ((plane == 0) &&
     (((x->txfm_search_info).blk_skip
       [(int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [local_b8] * blk_row + blk_col)] & 1) != 0)) {
    local_e0[local_d8] = 0;
    *(undefined1 *)(*(long *)((long)&x->plane[0].txb_entropy_ctx + local_c0) + local_d8) = 0;
    TVar11 = '\0';
  }
  else {
    av1_subtract_txb(x,plane,plane_bsize,blk_col,blk_row,tx_size);
    pMVar7 = *(x->e_mbd).mi;
    uVar2 = *(ushort *)&pMVar7->field_0xa7;
    if (((x->e_mbd).lossless[uVar2 & 7] == 0) && ((0x61810UL >> (uVar10 & 0x3f) & 1) == 0)) {
      if (plane == 0) {
        local_98 = (ulong)CONCAT11((char)(uVar2 >> 8),
                                   (x->e_mbd).tx_type_map
                                   [(x->e_mbd).tx_type_map_stride * blk_row + blk_col]);
      }
      else {
        if (((char)uVar2 < '\0') || ('\0' < pMVar7->ref_frame[0])) {
          bVar9 = (x->e_mbd).tx_type_map
                  [(blk_row << ((byte)(x->e_mbd).plane[1].subsampling_y & 0x1f)) *
                   (x->e_mbd).tx_type_map_stride +
                   (blk_col << ((byte)(x->e_mbd).plane[1].subsampling_x & 0x1f))];
          uVar12 = 1;
          if (-1 < (char)uVar2) {
            uVar12 = (uint)('\0' < pMVar7->ref_frame[0]);
          }
        }
        else {
          bVar9 = intra_mode_to_tx_type__intra_mode_to_tx_type
                  [(byte)get_uv_mode_uv2y[pMVar7->uv_mode]];
          uVar12 = 0;
        }
        if ((0x18608UL >> (uVar10 & 0x3f) & 1) == 0) {
          if (*(char *)(lVar6 + 0x3c175) == '\0') {
            uVar12 = (uint)av1_ext_tx_set_lookup[0]
                           [(ulong)((0x60604UL >> (uVar10 & 0x3f) & 1) != 0) + (ulong)(uVar12 * 2)];
          }
          else {
            uVar12 = (uint)(byte)((uVar12 == 0) + 1);
          }
        }
        local_98 = (ulong)bVar9;
        if (*(int *)((long)av1_ext_tx_used[0] + local_98 * 4 + (ulong)(uVar12 << 6)) == 0) {
          local_98 = 0;
        }
      }
    }
    else {
      local_98 = 0;
    }
    local_a0 = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x18) + lVar16);
    local_a8 = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x20) + lVar17);
    cVar1 = *(char *)((long)arg + 0x29);
    bVar18 = *(char *)((long)arg + 0x28) == '\0';
    TVar11 = (TX_TYPE)local_98;
    av1_setup_xform((AV1_COMMON *)(lVar6 + 0x3bf80),x,tx_size,TVar11,&txfm_param);
    iVar3 = *(int *)(lVar6 + 0x423fc);
    local_58.log_scale = av1_get_tx_scale(tx_size);
    local_58.xform_quant_idx = (int)(!bVar18 && cVar1 == '\x02' || cVar1 == '\0');
    quant_params = (CommonQuantParams *)(lVar6 + 0x3c1e8);
    local_58.tx_size = tx_size;
    local_58.use_quant_b_adapt = iVar3;
    local_58.use_optimize_b = (uint)((bVar18 || cVar1 != '\x02') && cVar1 != '\0');
    local_58.qmatrix = av1_get_qmatrix(quant_params,xd,plane,tx_size,TVar11);
    local_58.iqmatrix = av1_get_iqmatrix(quant_params,xd,plane,tx_size,TVar11);
    plane_bsize_00 = (BLOCK_SIZE)local_b8;
    av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize_00,&txfm_param,&local_58);
    if (local_58.use_optimize_b != 0) {
      get_txb_ctx(plane_bsize_00,tx_size,plane,local_a0,local_a8,&txb_ctx);
      av1_optimize_b(*arg,x,plane,block,tx_size,TVar11,&txb_ctx,&dummy_rate_cost);
    }
    av1_dropout_qcoeff(x,plane,block,tx_size,TVar11,quant_params->base_qindex);
    TVar11 = (TX_TYPE)local_98;
  }
  lVar16 = local_c0;
  lVar17 = local_d8;
  puVar8 = local_e0;
  if (local_e0[local_d8] == 0) {
    bVar18 = true;
  }
  else {
    av1_inverse_transform_block
              (xd,local_90,plane,TVar11,tx_size,local_88,(int)local_80,(uint)local_e0[local_d8],
               (uint)*(byte *)(lVar6 + 0x3c175));
    bVar18 = puVar8[lVar17] == 0;
  }
  lVar6 = local_d0;
  if ((plane == 0) && (bVar18)) {
    iVar3 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar3 * blk_row + blk_col] = '\0';
    iVar4 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    iVar5 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (((0x41010UL >> (uVar10 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar10 & 0x3f) & 1) != 0)) {
      lVar13 = iVar3 * local_d0 + local_b0;
      lVar14 = 0;
      do {
        lVar15 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar15 + lVar13] = '\0';
          lVar15 = lVar15 + 4;
        } while (lVar15 < iVar4);
        lVar14 = lVar14 + 4;
        lVar13 = lVar13 + (long)iVar3 * 4;
      } while (lVar14 < iVar5);
      goto LAB_001b549c;
    }
    local_c8->skip_txfm = '\0';
  }
  else {
LAB_001b549c:
    local_c8->skip_txfm = '\0';
    if (plane != 0) goto LAB_001b54cf;
  }
  if ((x->e_mbd).cfl.store_y != 0) {
    cfl_store_tx(xd,blk_row,blk_col,tx_size,(BLOCK_SIZE)local_b8);
  }
LAB_001b54cf:
  lVar13 = *(long *)((long)arg + 0x20);
  uVar12 = (uint)*(byte *)(*(long *)(*(long *)((long)arg + 8) + 0x28 + lVar16) + lVar17);
  memset((void *)(local_b0 + *(long *)((long)arg + 0x18)),uVar12,(long)tx_size_wide_unit[tx_size]);
  memset((void *)(lVar6 + lVar13),uVar12,(long)tx_size_high_unit[tx_size]);
  return;
}

Assistant:

static void encode_block_intra_and_set_context(int plane, int block,
                                               int blk_row, int blk_col,
                                               BLOCK_SIZE plane_bsize,
                                               TX_SIZE tx_size, void *arg) {
  encode_block_intra(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg);

  struct encode_b_args *const args = arg;
  MACROBLOCK *x = args->x;
  ENTROPY_CONTEXT *a = &args->ta[blk_col];
  ENTROPY_CONTEXT *l = &args->tl[blk_row];
  av1_set_txb_context(x, plane, block, tx_size, a, l);
}